

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_resource_manager.cpp
# Opt level: O0

unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_> __thiscall
CS248::GLResourceManager::bindFrameBuffer(GLResourceManager *this,FrameBufferId fbid)

{
  FrameBufferCleanup *this_00;
  _Head_base<0UL,_CS248::Cleanup_*,_false> in_RDI;
  _Head_base<0UL,_CS248::Cleanup_*,_false> this_01;
  FrameBufferId in_stack_ffffffffffffffd4;
  
  this_01._M_head_impl = in_RDI._M_head_impl;
  this_00 = (FrameBufferCleanup *)operator_new(8);
  anon_unknown_10::FrameBufferCleanup::FrameBufferCleanup(this_00,in_stack_ffffffffffffffd4);
  std::unique_ptr<CS248::Cleanup,std::default_delete<CS248::Cleanup>>::
  unique_ptr<std::default_delete<CS248::Cleanup>,void>
            ((unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_> *)
             this_01._M_head_impl,in_RDI._M_head_impl);
  return (__uniq_ptr_data<CS248::Cleanup,_std::default_delete<CS248::Cleanup>,_true,_true>)
         (tuple<CS248::Cleanup_*,_std::default_delete<CS248::Cleanup>_>)this_01._M_head_impl;
}

Assistant:

std::unique_ptr<Cleanup> GLResourceManager::bindFrameBuffer(FrameBufferId fbid) {
  return std::unique_ptr<Cleanup>{ new FrameBufferCleanup(fbid) };
}